

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::ComputePDBOutputDir
          (cmGeneratorTarget *this,string *kind,string *config,string *out)

{
  size_type sVar1;
  cmGlobalGenerator *pcVar2;
  bool bVar3;
  cmValue cVar4;
  string *in_base;
  string configProp;
  string propertyName;
  string configUpper;
  allocator<char> local_12a;
  allocator<char> local_129;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  if (kind->_M_string_length != 0) {
    cmStrCat<std::__cxx11::string_const&,char_const(&)[18]>(&local_e8,kind,(char (*) [18])0x6c62c6);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  std::__cxx11::string::string((string *)&local_e8,(string *)config);
  cmsys::SystemTools::UpperCase(&local_48,&local_e8);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  if (kind->_M_string_length != 0) {
    cmStrCat<std::__cxx11::string_const&,char_const(&)[19],std::__cxx11::string&>
              (&local_108,kind,(char (*) [19])0x6d3ad3,&local_48);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
  }
  cVar4 = GetProperty(this,&local_c8);
  if (cVar4.Value == (string *)0x0) {
    cVar4 = GetProperty(this,&local_a8);
    if (cVar4.Value == (string *)0x0) goto LAB_004374ff;
    std::__cxx11::string::string((string *)&local_88,(string *)cVar4.Value);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (&local_108,&local_88,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_128);
    std::__cxx11::string::operator=((string *)out,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_88);
    bVar3 = std::operator!=(out,cVar4.Value);
    if (!bVar3) goto LAB_004374ff;
  }
  else {
    std::__cxx11::string::string((string *)&local_68,(string *)cVar4.Value);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    local_128._M_string_length = 0;
    local_128.field_2._M_local_buf[0] = '\0';
    cmGeneratorExpression::Evaluate
              (&local_108,&local_68,this->LocalGenerator,config,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_128);
    std::__cxx11::string::operator=((string *)out,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_68);
  }
  local_e8._M_string_length = 0;
  *local_e8._M_dataplus._M_p = '\0';
LAB_004374ff:
  sVar1 = out->_M_string_length;
  if (sVar1 != 0) {
    in_base = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
    cmsys::SystemTools::CollapseFullPath(&local_108,out,in_base);
    std::__cxx11::string::operator=((string *)out,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    if (local_e8._M_string_length != 0) {
      pcVar2 = this->LocalGenerator->GlobalGenerator;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"/",&local_129);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_12a);
      (*pcVar2->_vptr_cmGlobalGenerator[0x1a])(pcVar2,&local_108,&local_e8,&local_128,out);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_108);
    }
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_a8);
  return sVar1 != 0;
}

Assistant:

bool cmGeneratorTarget::ComputePDBOutputDir(const std::string& kind,
                                            const std::string& config,
                                            std::string& out) const
{
  // Look for a target property defining the target output directory
  // based on the target type.
  std::string propertyName;
  if (!kind.empty()) {
    propertyName = cmStrCat(kind, "_OUTPUT_DIRECTORY");
  }
  std::string conf = config;

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  std::string configProp;
  if (!kind.empty()) {
    configProp = cmStrCat(kind, "_OUTPUT_DIRECTORY_", configUpper);
  }

  // Select an output directory.
  if (cmValue config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    out = cmGeneratorExpression::Evaluate(*config_outdir, this->LocalGenerator,
                                          config);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (cmValue outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    out =
      cmGeneratorExpression::Evaluate(*outdir, this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != *outdir) {
      conf.clear();
    }
  }
  if (out.empty()) {
    return false;
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, "", out);
  }
  return true;
}